

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O0

string * ApprovalTests::HelpMessages::envVarErrorMessage
                   (string *envVarName,string *selected,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *knowns,string *helpMessage)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 in_RCX;
  string *in_RDI;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *known;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc78;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc80;
  allocator *paVar3;
  string *in_stack_fffffffffffffc98;
  string *this;
  allocator *find;
  string *in_stack_fffffffffffffca8;
  string local_338 [39];
  allocator local_311;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  string *in_stack_fffffffffffffd78;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  string local_220 [32];
  string local_200 [48];
  reference local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  undefined8 local_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0;
  string *local_28;
  undefined8 local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  local_1b8 = local_20;
  local_1c0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffc78);
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(in_stack_fffffffffffffc78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffc80,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffc78);
    if (!bVar1) break;
    local_1d0 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_1c0);
    poVar2 = ::std::operator<<(&local_1a0,"* ");
    in_stack_fffffffffffffca8 = (string *)::std::operator<<(poVar2,(string *)local_1d0);
    ::std::operator<<((ostream *)in_stack_fffffffffffffca8,'\n');
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1c0);
  }
  ::std::__cxx11::string::string(local_220,local_28);
  find = &local_241;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_240,"[selected]",find);
  StringUtils::replaceAll(in_stack_fffffffffffffca8,(string *)find,in_stack_fffffffffffffc98);
  this = local_200;
  ::std::__cxx11::string::operator=(local_28,this);
  ::std::__cxx11::string::~string(this);
  ::std::__cxx11::string::~string(local_240);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_241);
  ::std::__cxx11::string::~string(local_220);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffd78,local_28);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_2a8,"[envVarName]",&local_2a9);
  StringUtils::replaceAll(in_stack_fffffffffffffca8,(string *)find,(string *)this);
  ::std::__cxx11::string::operator=(local_28,local_268);
  ::std::__cxx11::string::~string(local_268);
  ::std::__cxx11::string::~string(local_2a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
  ::std::__cxx11::string::string(local_2f0,local_28);
  paVar3 = &local_311;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_310,"[known]",paVar3);
  ::std::__cxx11::stringstream::str();
  StringUtils::replaceAll(in_stack_fffffffffffffca8,(string *)find,(string *)this);
  topAndTailHelpMessage(in_stack_fffffffffffffd78);
  ::std::__cxx11::string::~string(local_2d0);
  ::std::__cxx11::string::~string(local_338);
  ::std::__cxx11::string::~string(local_310);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_311);
  ::std::__cxx11::string::~string(local_2f0);
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return in_RDI;
}

Assistant:

std::string HelpMessages::envVarErrorMessage(const std::string& envVarName,
                                                 const std::string& selected,
                                                 const std::vector<std::string>& knowns,
                                                 std::string& helpMessage)
    {
        std::stringstream ss;
        for (auto& known : knowns)
        {
            ss << "* " << known << '\n';
        }
        helpMessage = StringUtils::replaceAll(helpMessage, "[selected]", selected);
        helpMessage = StringUtils::replaceAll(helpMessage, "[envVarName]", envVarName);
        return topAndTailHelpMessage(
            StringUtils::replaceAll(helpMessage, "[known]", ss.str()));
    }